

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O2

void __thiscall Fl_Text_Display_Type::ideal_size(Fl_Text_Display_Type *this,int *w,int *h)

{
  Fl_Widget *pFVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  double extraout_XMM0_Qa;
  
  pFVar1 = (this->super_Fl_Widget_Type).o;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,(ulong)(uint)pFVar1[3].h_,(ulong)*(uint *)&pFVar1[3].label_.value);
  iVar2 = Fl::box_dh((uint)((this->super_Fl_Widget_Type).o)->box_);
  *h = *h - iVar2;
  iVar2 = Fl::box_dw((uint)((this->super_Fl_Widget_Type).o)->box_);
  *w = *w - iVar2;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x38])(fl_graphics_driver,0x6d);
  iVar6 = *w + (int)extraout_XMM0_Qa + -1;
  iVar2 = Fl::box_dw((uint)((this->super_Fl_Widget_Type).o)->box_);
  *w = iVar2 + (iVar6 - iVar6 % (int)extraout_XMM0_Qa);
  iVar2 = *h;
  iVar6 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
  iVar3 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
  iVar4 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
  iVar5 = Fl::box_dh((uint)((this->super_Fl_Widget_Type).o)->box_);
  iVar5 = iVar5 + iVar4 * ((iVar6 + iVar2 + -1) / iVar3);
  iVar2 = 0x1e;
  if (0x1e < iVar5) {
    iVar2 = iVar5;
  }
  *h = iVar2;
  if (*w < 0x32) {
    *w = 0x32;
  }
  return;
}

Assistant:

virtual void ideal_size(int &w, int &h) {
    Fl_Text_Display *myo = (Fl_Text_Display *)o;
    fl_font(myo->textfont(), myo->textsize());
    h -= Fl::box_dh(o->box());
    w -= Fl::box_dw(o->box());
    int ww = (int)fl_width('m');
    w = ((w + ww - 1) / ww) * ww + Fl::box_dw(o->box());
    h = ((h + fl_height() - 1) / fl_height()) * fl_height() +
        Fl::box_dh(o->box());
    if (h < 30) h = 30;
    if (w < 50) w = 50;
  }